

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float param_2,float center_y_ratio)

{
  ImGuiContext *g;
  float fVar1;
  float fVar2;
  
  if ((0.0 <= center_y_ratio) && (center_y_ratio <= 1.0)) {
    fVar2 = 0.0;
    if ((window->Flags & 1) == 0) {
      fVar2 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar2 = fVar2 * window->ParentWindow->FontWindowScale;
      }
      fVar1 = (GImGui->Style).FramePadding.y;
      fVar2 = fVar1 + fVar1 + fVar2;
    }
    fVar1 = ImGuiWindow::MenuBarHeight(window);
    (window->ScrollTarget).y = (float)(int)((param_2 - (fVar1 + fVar2)) + (window->Scroll).y);
    (window->ScrollTargetCenterRatio).y = center_y_ratio;
    return;
  }
  __assert_fail("center_y_ratio >= 0.0f && center_y_ratio <= 1.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x1c7e,"void ImGui::SetScrollFromPosY(ImGuiWindow *, float, float)");
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    // We store a target position so centering can occur on the next frame when we are guaranteed to have a known window size
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    local_y -= decoration_up_height;
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y);
    window->ScrollTargetCenterRatio.y = center_y_ratio;
}